

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O2

int AF_AActor_DamageMobj
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  AActor *source;
  AActor *inflictor;
  char *pcVar4;
  AActor *target;
  FName local_3c;
  double local_38;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0040a1de;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0040a1bc:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0040a1de:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x630,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  target = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (target == (AActor *)0x0) goto LAB_0040a026;
    bVar2 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0040a1de;
    }
  }
  else {
    if (target != (AActor *)0x0) goto LAB_0040a1bc;
LAB_0040a026:
    target = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0040a1fd;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_0040a1c5:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0040a1fd:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x631,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  inflictor = (AActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (inflictor == (AActor *)0x0) goto LAB_0040a07e;
    bVar2 = DObject::IsKindOf((DObject *)inflictor,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "inflictor == NULL || inflictor->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0040a1fd;
    }
  }
  else {
    if (inflictor != (AActor *)0x0) goto LAB_0040a1c5;
LAB_0040a07e:
    inflictor = (AActor *)0x0;
  }
  if ((uint)numparam < 3) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0040a21c;
  }
  if (param[2].field_0.field_3.Type != '\x03') {
LAB_0040a1ce:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0040a21c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x632,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  source = (AActor *)param[2].field_0.field_1.a;
  if (param[2].field_0.field_1.atag == 1) {
    if (source == (AActor *)0x0) goto LAB_0040a0d5;
    bVar2 = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "source == NULL || source->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0040a21c;
    }
  }
  else {
    if (source != (AActor *)0x0) goto LAB_0040a1ce;
LAB_0040a0d5:
    source = (AActor *)0x0;
  }
  if (numparam == 3) {
    pcVar4 = "(paramnum) < numparam";
LAB_0040a244:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x633,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_0040a244;
  }
  if ((uint)numparam < 5) {
    pcVar4 = "(paramnum) < numparam";
LAB_0040a26c:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x634,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar4 = "param[paramnum].Type == REGT_INT";
    goto LAB_0040a26c;
  }
  pVVar1 = param + 3;
  local_3c.Index = param[4].field_0.i;
  if (numparam == 5) {
    param = defaultparam->Array;
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_0040a2d2:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x635,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar3 = param[5].field_0.i;
  }
  else {
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar4 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_0040a2d2;
    }
    iVar3 = param[5].field_0.i;
    if (6 < (uint)numparam) {
      if (param[6].field_0.field_3.Type != '\x01') {
        pcVar4 = "(param[paramnum]).Type == REGT_FLOAT";
        goto LAB_0040a28b;
      }
      goto LAB_0040a163;
    }
    param = defaultparam->Array;
  }
  if (param[6].field_0.field_3.Type != '\x01') {
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_0040a28b:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                  ,0x636,
                  "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_0040a163:
  local_38 = (double)param[6].field_0.field_1.a;
  iVar3 = P_DamageMobj(target,inflictor,source,(pVVar1->field_0).i,&local_3c,iVar3,(DAngle)local_38)
  ;
  if (numret < 1) {
    iVar3 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_interaction.cpp"
                    ,0x637,
                    "int AF_AActor_DamageMobj(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    VMReturn::SetInt(ret,iVar3);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, DamageMobj)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(inflictor, AActor);
	PARAM_OBJECT(source, AActor);
	PARAM_INT(damage);
	PARAM_NAME(mod);
	PARAM_INT_DEF(flags);
	PARAM_FLOAT_DEF(angle);
	ACTION_RETURN_INT(P_DamageMobj(self, inflictor, source, damage, mod, flags, angle));
}